

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityTestOutput.cpp
# Opt level: O0

void __thiscall TeamCityTestOutput::printCurrentTestEnded(TeamCityTestOutput *this,TestResult *res)

{
  size_t sVar1;
  TestResult *in_RSI;
  long *in_RDI;
  TeamCityTestOutput *in_stack_ffffffffffffffd0;
  TestResult *local_10;
  
  if (in_RDI[4] != 0) {
    local_10 = in_RSI;
    (**(code **)(*in_RDI + 0x58))(in_RDI,"##teamcity[testFinished name=\'");
    UtestShell::getName((UtestShell *)&stack0xffffffffffffffe0);
    SimpleString::asCharString((SimpleString *)0x178399);
    printEscaped(in_stack_ffffffffffffffd0,(char *)in_RDI);
    SimpleString::~SimpleString((SimpleString *)0x1783bb);
    (**(code **)(*in_RDI + 0x58))(in_RDI,"\' duration=\'");
    sVar1 = TestResult::getCurrentTestTotalExecutionTime(local_10);
    (**(code **)(*in_RDI + 0x68))(in_RDI,sVar1);
    (**(code **)(*in_RDI + 0x58))(in_RDI,"\']\n");
  }
  return;
}

Assistant:

void TeamCityTestOutput::printCurrentTestEnded(const TestResult& res)
{
    if (!currtest_)
        return;

    print("##teamcity[testFinished name='");
    printEscaped(currtest_->getName().asCharString());
    print("' duration='");
    print(res.getCurrentTestTotalExecutionTime());
    print("']\n");
}